

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

Node * __thiscall llvm::yaml::Document::parseBlockNode(Document *this)

{
  StringRef Value;
  StringRef Val;
  StringRef RawVal;
  StringRef Tag;
  StringRef Tag_00;
  Token *pTVar1;
  SequenceNode *this_00;
  size_t sVar2;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *puVar3;
  char *pcVar4;
  StringRef Anchor;
  StringRef Anchor_00;
  StringRef Anchor_01;
  StringRef Anchor_02;
  StringRef SVar5;
  StringRef Tag_01;
  StringRef Tag_02;
  MappingType MT;
  SequenceType ST;
  Token TagInfo;
  Token AnchorInfo;
  Token T;
  StringRef NullTerminatedStr;
  Token local_1b8;
  Token local_180;
  Token local_148;
  Token local_110;
  Token local_d8;
  Token local_a0;
  Token local_68;
  
  pTVar1 = peekNext(this);
  Token::Token(&T,pTVar1);
  AnchorInfo.Kind = TK_Error;
  AnchorInfo.Range.Data = (char *)0x0;
  AnchorInfo.Range.Length = 0;
  AnchorInfo.Value._M_dataplus._M_p = (pointer)&AnchorInfo.Value.field_2;
  AnchorInfo.Value._M_string_length = 0;
  TagInfo.Kind = TK_Error;
  TagInfo.Range.Data = (char *)0x0;
  TagInfo.Range.Length = 0;
  TagInfo.Value._M_dataplus._M_p = (pointer)&TagInfo.Value.field_2;
  TagInfo.Value._M_string_length = 0;
  AnchorInfo.Value.field_2._M_local_buf[0] = '\0';
  TagInfo.Value.field_2._M_local_buf[0] = '\0';
LAB_0018b9f7:
  switch(T.Kind) {
  case TK_Error:
    goto switchD_0018ba10_caseD_0;
  default:
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x48,0x10);
    NullNode::NullNode((NullNode *)this_00,&this->stream->CurrentDoc);
    goto LAB_0018be75;
  case TK_BlockEntry:
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    puVar3 = &this->stream->CurrentDoc;
    sVar2 = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    pcVar4 = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    ST = ST_Indentless;
    break;
  case TK_BlockSequenceStart:
    getNext(&local_a0,this);
    std::__cxx11::string::_M_dispose();
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    puVar3 = &this->stream->CurrentDoc;
    sVar2 = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    pcVar4 = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    ST = ST_Block;
    break;
  case TK_BlockMappingStart:
    getNext(&local_d8,this);
    std::__cxx11::string::_M_dispose();
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    puVar3 = &this->stream->CurrentDoc;
    sVar2 = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    pcVar4 = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    MT = MT_Block;
    goto LAB_0018bd69;
  case TK_FlowSequenceStart:
    getNext(&local_110,this);
    std::__cxx11::string::_M_dispose();
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    puVar3 = &this->stream->CurrentDoc;
    sVar2 = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    pcVar4 = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    ST = ST_Flow;
    break;
  case TK_FlowMappingStart:
    getNext(&local_148,this);
    std::__cxx11::string::_M_dispose();
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    puVar3 = &this->stream->CurrentDoc;
    sVar2 = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    pcVar4 = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    MT = MT_Flow;
    goto LAB_0018bd69;
  case TK_Key:
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    puVar3 = &this->stream->CurrentDoc;
    sVar2 = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    pcVar4 = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    MT = MT_Inline;
LAB_0018bd69:
    Anchor_01.Length = sVar2;
    Anchor_01.Data = pcVar4;
    Tag_02.Length = TagInfo.Range.Length;
    Tag_02.Data = TagInfo.Range.Data;
    MappingNode::MappingNode((MappingNode *)this_00,puVar3,Anchor_01,Tag_02,MT);
    goto LAB_0018be75;
  case TK_Scalar:
    getNext(&local_180,this);
    std::__cxx11::string::_M_dispose();
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    Anchor_02.Length = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    Anchor_02.Data = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    Tag_00.Length = TagInfo.Range.Length;
    Tag_00.Data = TagInfo.Range.Data;
    Val.Length = T.Range.Length;
    Val.Data = T.Range.Data;
    ScalarNode::ScalarNode((ScalarNode *)this_00,&this->stream->CurrentDoc,Anchor_02,Tag_00,Val);
    goto LAB_0018be75;
  case TK_BlockScalar:
    getNext(&local_1b8,this);
    std::__cxx11::string::_M_dispose();
    NullTerminatedStr.Length = T.Value._M_string_length + 1;
    NullTerminatedStr.Data = T.Value._M_dataplus._M_p;
    SVar5 = StringRef::copy<llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>
                      (&NullTerminatedStr,&this->NodeAllocator);
    if (SVar5.Length == 0) {
      __assert_fail("size() >= N && \"Dropping more elements than exist\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0x28f,"StringRef llvm::StringRef::drop_back(size_t) const");
    }
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    Anchor.Length = AnchorInfo.Range.Length - (AnchorInfo.Range.Length != 0);
    Anchor.Data = AnchorInfo.Range.Data + (AnchorInfo.Range.Length != 0);
    Tag.Length = TagInfo.Range.Length;
    Tag.Data = TagInfo.Range.Data;
    Value.Length = SVar5.Length - 1;
    Value.Data = SVar5.Data;
    RawVal.Length = T.Range.Length;
    RawVal.Data = T.Range.Data;
    BlockScalarNode::BlockScalarNode
              ((BlockScalarNode *)this_00,&this->stream->CurrentDoc,Anchor,Tag,Value,RawVal);
    goto LAB_0018be75;
  case TK_Alias:
    getNext(&local_68,this);
    std::__cxx11::string::_M_dispose();
    this_00 = (SequenceNode *)
              BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>::Allocate
                        (&this->NodeAllocator,0x58,0x10);
    SVar5.Length = T.Range.Length - (T.Range.Length != 0);
    SVar5.Data = T.Range.Data + (T.Range.Length != 0);
    AliasNode::AliasNode((AliasNode *)this_00,&this->stream->CurrentDoc,SVar5);
    goto LAB_0018be75;
  case TK_Anchor:
    if (AnchorInfo.Kind == TK_Anchor) {
      pcVar4 = "Already encountered an anchor for this node!";
      goto LAB_0018be4f;
    }
    getNext((Token *)&NullTerminatedStr,this);
    pTVar1 = &AnchorInfo;
LAB_0018ba46:
    Token::operator=(pTVar1,(Token *)&NullTerminatedStr);
    std::__cxx11::string::_M_dispose();
    pTVar1 = peekNext(this);
    Token::operator=(&T,pTVar1);
    goto LAB_0018b9f7;
  case TK_Tag:
    if (TagInfo.Kind != TK_Tag) {
      getNext((Token *)&NullTerminatedStr,this);
      pTVar1 = &TagInfo;
      goto LAB_0018ba46;
    }
    pcVar4 = "Already encountered a tag for this node!";
LAB_0018be4f:
    Twine::Twine((Twine *)&NullTerminatedStr,pcVar4);
    setError(this,(Twine *)&NullTerminatedStr,&T);
    goto switchD_0018ba10_caseD_0;
  }
  Anchor_00.Length = sVar2;
  Anchor_00.Data = pcVar4;
  Tag_01.Length = TagInfo.Range.Length;
  Tag_01.Data = TagInfo.Range.Data;
  SequenceNode::SequenceNode(this_00,puVar3,Anchor_00,Tag_01,ST);
  goto LAB_0018be75;
switchD_0018ba10_caseD_0:
  this_00 = (SequenceNode *)0x0;
LAB_0018be75:
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return &this_00->super_Node;
}

Assistant:

Node *Document::parseBlockNode() {
  Token T = peekNext();
  // Handle properties.
  Token AnchorInfo;
  Token TagInfo;
parse_property:
  switch (T.Kind) {
  case Token::TK_Alias:
    getNext();
    return new (NodeAllocator) AliasNode(stream.CurrentDoc, T.Range.substr(1));
  case Token::TK_Anchor:
    if (AnchorInfo.Kind == Token::TK_Anchor) {
      setError("Already encountered an anchor for this node!", T);
      return nullptr;
    }
    AnchorInfo = getNext(); // Consume TK_Anchor.
    T = peekNext();
    goto parse_property;
  case Token::TK_Tag:
    if (TagInfo.Kind == Token::TK_Tag) {
      setError("Already encountered a tag for this node!", T);
      return nullptr;
    }
    TagInfo = getNext(); // Consume TK_Tag.
    T = peekNext();
    goto parse_property;
  default:
    break;
  }

  switch (T.Kind) {
  case Token::TK_BlockEntry:
    // We got an unindented BlockEntry sequence. This is not terminated with
    // a BlockEnd.
    // Don't eat the TK_BlockEntry, SequenceNode needs it.
    return new (NodeAllocator) SequenceNode( stream.CurrentDoc
                                           , AnchorInfo.Range.substr(1)
                                           , TagInfo.Range
                                           , SequenceNode::ST_Indentless);
  case Token::TK_BlockSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Block);
  case Token::TK_BlockMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Block);
  case Token::TK_FlowSequenceStart:
    getNext();
    return new (NodeAllocator)
      SequenceNode( stream.CurrentDoc
                  , AnchorInfo.Range.substr(1)
                  , TagInfo.Range
                  , SequenceNode::ST_Flow);
  case Token::TK_FlowMappingStart:
    getNext();
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Flow);
  case Token::TK_Scalar:
    getNext();
    return new (NodeAllocator)
      ScalarNode( stream.CurrentDoc
                , AnchorInfo.Range.substr(1)
                , TagInfo.Range
                , T.Range);
  case Token::TK_BlockScalar: {
    getNext();
    StringRef NullTerminatedStr(T.Value.c_str(), T.Value.length() + 1);
    StringRef StrCopy = NullTerminatedStr.copy(NodeAllocator).drop_back();
    return new (NodeAllocator)
        BlockScalarNode(stream.CurrentDoc, AnchorInfo.Range.substr(1),
                        TagInfo.Range, StrCopy, T.Range);
  }
  case Token::TK_Key:
    // Don't eat the TK_Key, KeyValueNode expects it.
    return new (NodeAllocator)
      MappingNode( stream.CurrentDoc
                 , AnchorInfo.Range.substr(1)
                 , TagInfo.Range
                 , MappingNode::MT_Inline);
  case Token::TK_DocumentStart:
  case Token::TK_DocumentEnd:
  case Token::TK_StreamEnd:
  default:
    // TODO: Properly handle tags. "[!!str ]" should resolve to !!str "", not
    //       !!null null.
    return new (NodeAllocator) NullNode(stream.CurrentDoc);
  case Token::TK_Error:
    return nullptr;
  }
  llvm_unreachable("Control flow shouldn't reach here.");
  return nullptr;
}